

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall CTestGen9Resource_TestCCS_Test::TestBody(CTestGen9Resource_TestCCS_Test *this)

{
  TEST_BPP Bpp;
  GMM_RESOURCE_TYPE GVar1;
  GMM_RESOURCE_FORMAT GVar2;
  uint32_t uVar3;
  undefined *puVar5;
  GMM_RESOURCE_INFO *ResourceInfo;
  int *piVar6;
  long lVar7;
  long lVar8;
  CTestGen9Resource_TestCCS_Test *pCVar9;
  uint uVar10;
  uint ExpectedValue;
  ulong uVar11;
  uint32_t TestDimensions [4] [3];
  vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
  List;
  GMM_RESCREATE_PARAMS local_c8;
  long local_48;
  long local_40;
  CTestGen9Resource_TestCCS_Test *local_38;
  int iVar4;
  
  TestDimensions[0][2] = 0;
  TestDimensions[1][0] = 0;
  TestDimensions[2][0] = 0;
  TestDimensions[3][0] = 1;
  TestDimensions[0][0] = 0;
  TestDimensions[0][1] = 1;
  TestDimensions[1][1] = 1;
  TestDimensions[1][2] = 1;
  TestDimensions[2][1] = 1;
  TestDimensions[2][2] = 1;
  TestDimensions[3][1] = 0;
  TestDimensions[3][2] = 0;
  local_38 = this;
  BuildInputIterator((vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
                      *)(TestDimensions[3] + 1),4,2);
  pCVar9 = local_38;
  for (piVar6 = (int *)TestDimensions[3]._4_8_; piVar6 != (int *)0x0; piVar6 = piVar6 + 5) {
    uVar10 = piVar6[2];
    Bpp = piVar6[3];
    uVar11 = (ulong)Bpp;
    lVar8 = (long)piVar6[4];
    local_c8.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    local_c8.MultiTileArch._0_1_ = 0;
    local_c8.MultiTileArch.GpuVaMappingSet = '\0';
    local_c8.MultiTileArch.LocalMemEligibilitySet = '\0';
    local_c8.MultiTileArch.LocalMemPreferredSet = '\0';
    local_c8.MultiTileArch.Reserved = 0;
    local_c8.ExistingSysMemSize = 0;
    local_c8.MaximumRenamingListLength = 0;
    local_c8.NoGfxMemory = '\0';
    local_c8._109_3_ = 0;
    local_c8.RotateInfo = 0;
    local_c8._84_4_ = 0;
    local_c8.pExistingSysMem = 0;
    local_c8.MaxLod = 0;
    local_c8.ArraySize = 0;
    local_c8.BaseAlignment = 0;
    local_c8.OverridePitch = 0;
    local_c8.field_6.BaseWidth64 = 0;
    local_c8.BaseHeight = 0;
    local_c8.Depth = 0;
    local_c8.MSAA.NumSamples = 0;
    local_c8.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    local_c8.CpTag = 0;
    local_c8._44_4_ = 0;
    local_c8.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    local_c8.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    local_c8.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    local_c8.Type = RESOURCE_INVALID;
    local_c8.Format = GMM_FORMAT_INVALID;
    local_c8.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    if (((1 < lVar8) && (uVar11 == 4 || (Bpp & ~TEST_BPP_16) == TEST_BPP_32)) &&
       ((uVar10 & 0xfffffffb) != 0)) {
      local_48 = (long)piVar6[1];
      local_40 = (long)*piVar6;
      CTestResource::SetTileFlag((CTestResource *)pCVar9,&local_c8,piVar6[4]);
      GVar1 = uVar10 + RESOURCE_1D;
      if (uVar10 == 4) {
        GVar1 = RESOURCE_BUFFER;
      }
      local_c8.Type = GVar1;
      local_c8.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)local_c8.Flags.Gpu & 0xffffffffff7fffbf | 0x800000);
      local_c8.ArraySize = *(uint32_t *)(&DAT_0018e734 + local_40 * 4);
      local_c8.NoGfxMemory = '\x01';
      GVar2 = CTestResource::SetResourceFormat((CTestResource *)pCVar9,Bpp);
      local_c8.Format = GVar2;
      puVar5 = &DAT_0018e8f0;
      if (uVar10 == 2) {
        puVar5 = &DAT_0018eaa0;
      }
      lVar7 = uVar11 * 0xc;
      uVar10 = *(uint *)(&DAT_0018ec64 + uVar11 * 4);
      local_c8.field_6._0_4_ =
           TestDimensions[local_48 + -1][1] * *(int *)(puVar5 + lVar7 + lVar8 * 0x3c) + 1;
      local_c8.field_6.BaseWidth64._4_4_ = 0;
      if (local_c8.Type == RESOURCE_CUBE) {
        local_c8.Depth = 0;
        local_c8.BaseHeight = local_c8.field_6._0_4_;
        uVar3 = 1;
      }
      else {
        local_c8.BaseHeight =
             *(int *)(puVar5 + lVar7 + 4 + lVar8 * 0x3c) * TestDimensions[local_48 + -1][2] + 1;
        uVar3 = 1;
        if (local_c8.Type == RESOURCE_3D) {
          uVar3 = *(int *)(puVar5 + lVar7 + 8 + lVar8 * 0x3c) * TestDimensions[local_48][0] + 1;
        }
      }
      local_c8.Depth = uVar3;
      local_c8.MSAA.NumSamples = 1;
      local_c8.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_c8.Flags.Gpu & 0xfffffffffffffffd);
      lVar8 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                        (CommonULT::pGmmULTClientContext,&local_c8);
      if (lVar8 != 0) {
        local_c8.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_c8.Flags.Gpu | 2);
        local_48 = lVar8;
        ResourceInfo = (GMM_RESOURCE_INFO *)
                       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                 (CommonULT::pGmmULTClientContext,&local_c8);
        pCVar9 = local_38;
        CTestResource::VerifyResourceHAlign<true>((CTestResource *)local_38,ResourceInfo,0x80);
        CTestResource::VerifyResourceVAlign<true>((CTestResource *)pCVar9,ResourceInfo,0x40);
        uVar10 = (int)((local_c8.field_6.BaseWidth64 + 0x7f & 0xffffffffffffff80) / (ulong)uVar10) +
                 0x7f;
        ExpectedValue = uVar10 & 0xffffff80;
        CTestResource::VerifyResourcePitch<true>((CTestResource *)pCVar9,ResourceInfo,ExpectedValue)
        ;
        CTestResource::VerifyResourcePitchInTiles<true>
                  ((CTestResource *)pCVar9,ResourceInfo,uVar10 >> 7);
        uVar10 = local_c8.BaseHeight + 0x3f & 0xffffffc0;
        if ((1 < local_c8.ArraySize) ||
           (uVar3 = local_c8.ArraySize, local_c8.Type - RESOURCE_3D < 2)) {
          local_40 = CONCAT44(local_40._4_4_,local_c8.Depth);
          CTestResource::VerifyResourceQPitch<true>
                    ((CTestResource *)pCVar9,ResourceInfo,(ulong)uVar10);
          iVar4 = (uint)(local_c8.Type == RESOURCE_CUBE) * 5 + 1;
          if (local_c8.Type == RESOURCE_3D) {
            iVar4 = (int)local_40;
          }
          uVar3 = iVar4 * local_c8.ArraySize;
          local_c8.ArraySize = uVar3;
          pCVar9 = local_38;
        }
        CTestResource::VerifyResourceSize<true>
                  ((CTestResource *)pCVar9,ResourceInfo,
                   (ulong)(((uVar10 >> 4) * uVar3 + 0x1f & 0xffffffe0) * ExpectedValue));
        lVar8 = local_48;
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,ResourceInfo);
      }
      (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                (CommonULT::pGmmULTClientContext,lVar8);
      pCVar9 = local_38;
    }
  }
  std::
  _Vector_base<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
  ::~_Vector_base((_Vector_base<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
                   *)(TestDimensions[3] + 1));
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestCCS)
{
    const uint32_t CCSTileSize[1][2] = {128, 32}; //CCS is TileY

    const uint32_t TestDimensions[4][3] = {
    //Input dimensions in #Tiles
    {0, 0, 0}, //1x1x1
    {1, 0, 0}, //2 Tilesx1x1
    {1, 1, 0}, //2 Tilesx 2x1
    {1, 1, 1}, //2 Tilesx 2x2
    };
    uint32_t TestArraySize[2] = {1, 9};

    uint32_t RTHAlign = 128, RTVAlign = 64; //Gen9 CCS's RT should be aligned to 128x64

    uint32_t TileDimX, TileDimY, TileDimZ, WidthDivisor, HeightDivisor, TileSize;
    uint32_t ExpectedMCSBpp;
    std::vector<tuple<int, int, int, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, TestDimension index, TestArraySize index
    auto Size = BuildInputIterator(List, 4, 2);       // Send size of TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        int                TestDimIdx = std::get<3>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<4>(element); //index into TestArraySize
        TileSize                      = (Tiling == TEST_TILEYS) ? GMM_KBYTE(64) : GMM_KBYTE(4);

        //Discard if un-supported Tiling/Res_type/bpp for this test
        if(Tiling < TEST_TILEY || !(Bpp == TEST_BPP_32 ||                         //Gen8: NO TileYs/Yf, CCS not supported for !TileY/Yf/Ys/X - gen8 support tilex
                                    Bpp == TEST_BPP_64 || Bpp == TEST_BPP_128) || //LRTC not supported on <32bpp
           ResType == TEST_RESOURCE_1D ||
           ResType == TEST_RESOURCE_BUFFER) //non-MSAA CCS, 1D is showing issues CCS becoming linear (Buffer is linear)
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, true); //Depth not Supported w/ CCS. Depth only has HiZ, and IMS
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);

        GetAlignmentAndTileDimensionsForCCS(Bpp, Tiling, ResType,
                                            TileDimX, TileDimY, TileDimZ, WidthDivisor, HeightDivisor);

        gmmParams.BaseWidth64 = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
        gmmParams.BaseHeight  = (gmmParams.Type == RESOURCE_CUBE) ? gmmParams.BaseWidth64 :
                                                                   TestDimensions[TestDimIdx][1] * TileDimY + 0x1;
        gmmParams.Depth           = (gmmParams.Type == RESOURCE_3D) ? TestDimensions[TestDimIdx][2] * TileDimZ + 0x1 : 0x1;
        gmmParams.MSAA.NumSamples = 1;
        gmmParams.Flags.Gpu.CCS   = 0;

        //RT surface
        GMM_RESOURCE_INFO *RTResourceInfo;
        RTResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        //No CCS surface if RT creation failed
        if(RTResourceInfo)
        {
            gmmParams.Flags.Gpu.CCS = 1;
            GMM_RESOURCE_INFO *CCSResourceInfo;
            CCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            VerifyResourceHAlign<true>(CCSResourceInfo, RTHAlign); //Check if RT for CCS creation was aligned to CCS's RT alignment
            VerifyResourceVAlign<true>(CCSResourceInfo, RTVAlign);
            uint32_t ExpectedPitch = GMM_ULT_ALIGN((uint32_t)(GMM_ULT_ALIGN(gmmParams.BaseWidth64, RTHAlign) / WidthDivisor), CCSTileSize[0][0]);
            VerifyResourcePitch<true>(CCSResourceInfo, ExpectedPitch);
            VerifyResourcePitchInTiles<true>(CCSResourceInfo, ExpectedPitch / CCSTileSize[0][0]); // 1 tileY wide

            uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, RTVAlign); // / HeightDivisor;
            if(gmmParams.ArraySize > 1 || gmmParams.Type == RESOURCE_CUBE || gmmParams.Type == RESOURCE_3D)
            {
                uint32_t DepthSlice = gmmParams.Depth;
                //if (gmmParams.Type == RESOURCE_3D && DepthSlice > 1)
                //{
                //    ExpectedQPitch *= DepthSlice;
                //}
                //else { // Should 3D surface Aux QPitch be distance between R-slices or not
                // If it must be R-slice distance, compute 3D QPitch, remove depthslice from arraysize
                VerifyResourceQPitch<true>(CCSResourceInfo, ExpectedQPitch); //verify false, else QPitch given for RT-size not CCS
                //}
                gmmParams.ArraySize *= (gmmParams.Type == RESOURCE_3D) ? DepthSlice : //3D R-slices
                                       (gmmParams.Type == RESOURCE_CUBE) ? 6 : 1;     //cube faces treated as array slices
            }

            ExpectedQPitch /= HeightDivisor;
            uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, CCSTileSize[0][1]);
            VerifyResourceSize<true>(CCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, GMM_KBYTE(4)));

            pGmmULTClientContext->DestroyResInfoObject(CCSResourceInfo);
        } //CCS

        pGmmULTClientContext->DestroyResInfoObject(RTResourceInfo);
    } //Iterate through all input tuples

    // Mip-mapped case
}